

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int cm_zlib_inflateUndermine(z_streamp strm,int subvert)

{
  int iVar1;
  inflate_state *state;
  int subvert_local;
  z_streamp strm_local;
  
  iVar1 = inflateStateCheck(strm);
  if (iVar1 == 0) {
    *(undefined4 *)(strm->state + 0x1be8) = 1;
    strm_local._4_4_ = -3;
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateUndermine(z_streamp strm, int subvert) {
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
    state->sane = !subvert;
    return Z_OK;
#else
    (void)subvert;
    state->sane = 1;
    return Z_DATA_ERROR;
#endif
}